

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

sockaddr_in mario::sockets::getPeerAddr(int sockfd)

{
  sockaddr_in sVar1;
  int iVar2;
  Writer *pWVar3;
  socklen_t addrlen;
  sockaddr_in peeraddr;
  socklen_t local_9c;
  undefined1 local_98 [8];
  uchar auStack_90 [8];
  Writer local_80;
  
  local_98._0_2_ = 0;
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  auStack_90[0] = '\0';
  auStack_90[1] = '\0';
  auStack_90[2] = '\0';
  auStack_90[3] = '\0';
  auStack_90[4] = '\0';
  auStack_90[5] = '\0';
  auStack_90[6] = '\0';
  auStack_90[7] = '\0';
  local_9c = 0x10;
  iVar2 = getpeername(sockfd,(sockaddr *)local_98,&local_9c);
  if (iVar2 < 0) {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_00133a10;
    local_80.m_msg = (LogMessage *)0x0;
    local_80.m_level = Fatal;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/SocketsOps.cpp"
    ;
    local_80.m_line = 0x69;
    local_80.m_func = "struct sockaddr_in mario::sockets::getPeerAddr(int)";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_80,1,"default");
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"sockets::getPeerAddr");
    }
    el::base::Writer::~Writer(&local_80);
  }
  sVar1.sin_zero[0] = auStack_90[0];
  sVar1.sin_zero[1] = auStack_90[1];
  sVar1.sin_zero[2] = auStack_90[2];
  sVar1.sin_zero[3] = auStack_90[3];
  sVar1.sin_zero[4] = auStack_90[4];
  sVar1.sin_zero[5] = auStack_90[5];
  sVar1.sin_zero[6] = auStack_90[6];
  sVar1.sin_zero[7] = auStack_90[7];
  sVar1.sin_family = local_98._0_2_;
  sVar1.sin_port = local_98._2_2_;
  sVar1.sin_addr.s_addr = local_98._4_4_;
  return sVar1;
}

Assistant:

struct sockaddr_in sockets::getPeerAddr(int sockfd) {
    struct sockaddr_in peeraddr;
    bzero(&peeraddr, sizeof(peeraddr));
    socklen_t addrlen = sizeof(peeraddr);
    if (::getpeername(sockfd, sockaddr_cast(&peeraddr), &addrlen) < 0) {
        LOG(FATAL) << "sockets::getPeerAddr";
    }
    return peeraddr;
}